

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLString.cpp
# Opt level: O2

bool xercesc_4_0::XMLString::isInList(XMLCh *toFind,XMLCh *enumList)

{
  XMLSize_t XVar1;
  bool bVar2;
  XMLCh XVar3;
  XMLSize_t XVar4;
  
  XVar1 = stringLen(toFind);
LAB_00267985:
  XVar3 = *enumList;
  bVar2 = XVar3 != L'\0';
  if (XVar3 == L'\0') {
LAB_002679cd:
    bVar2 = false;
  }
  else {
    for (XVar4 = 0; XVar1 != XVar4; XVar4 = XVar4 + 1) {
      if (enumList[XVar4] != toFind[XVar4]) {
        if (XVar1 != XVar4) goto LAB_002679b7;
        break;
      }
    }
    if ((enumList[XVar1] & 0xffdfU) != 0) {
LAB_002679b7:
      do {
        enumList = enumList + 1;
        if (XVar3 == L'\0') goto LAB_002679cd;
        if (XVar3 == L' ') goto LAB_00267985;
        XVar3 = *enumList;
      } while( true );
    }
  }
  return bVar2;
}

Assistant:

bool XMLString::isInList(const XMLCh* const toFind, const XMLCh* const enumList)
{
    //
    //  We loop through the values in the list via this outer loop. We end
    //  when we hit the end of the enum list or get a match.
    //
    const XMLCh* listPtr = enumList;
    const XMLSize_t findLen = XMLString::stringLen(toFind);
    while (*listPtr)
    {
        XMLSize_t testInd;
        for (testInd = 0; testInd < findLen; testInd++)
        {
            //
            //  If they don't match, then reset and try again. Note that
            //  hitting the end of the current item will cause a mismatch
            //  because there can be no spaces in the toFind string.
            //
            if (listPtr[testInd] != toFind[testInd])
                break;
        }

        //
        //  If we went the distance, see if we matched. If we did, the current
        //  list character has to be null or space.
        //
        if (testInd == findLen)
        {
            if ((listPtr[testInd] == chSpace) || !listPtr[testInd])
                return true;
        }

        // Run the list pointer up to the next substring
        while ((*listPtr != chSpace) && *listPtr)
            listPtr++;

        // If we hit the end, then we failed
        if (!*listPtr)
            return false;

        // Else move past the space and try again
        listPtr++;
    }

    // We never found it
    return false;
}